

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O0

int ipv6_from_asc(uint8_t *v6,char *in)

{
  int iVar1;
  undefined1 local_3c [8];
  IPV6_STAT v6stat;
  char *in_local;
  uint8_t *v6_local;
  
  v6stat.tmp[8] = '\0';
  v6stat.tmp[9] = '\0';
  v6stat.tmp[10] = '\0';
  v6stat.tmp[0xb] = '\0';
  v6stat.tmp[0xc] = 0xff;
  v6stat.tmp[0xd] = 0xff;
  v6stat.tmp[0xe] = 0xff;
  v6stat.tmp[0xf] = 0xff;
  v6stat.total = 0;
  v6stat._20_8_ = in;
  iVar1 = CONF_parse_list(in,0x3a,0,ipv6_cb,local_3c);
  if (iVar1 == 0) {
    return 0;
  }
  if (v6stat.tmp._12_4_ == -1) {
    if (v6stat.tmp._8_4_ != 0x10) {
      return 0;
    }
  }
  else {
    if (0xf < (int)v6stat.tmp._8_4_) {
      return 0;
    }
    if (3 < v6stat.total) {
      return 0;
    }
    if (v6stat.total == 3) {
      if (0 < (int)v6stat.tmp._8_4_) {
        return 0;
      }
    }
    else if (v6stat.total == 2) {
      if ((v6stat.tmp._12_4_ != 0) && (v6stat.tmp._12_4_ != v6stat.tmp._8_4_)) {
        return 0;
      }
    }
    else if ((v6stat.tmp._12_4_ == 0) || (v6stat.tmp._12_4_ == v6stat.tmp._8_4_)) {
      return 0;
    }
  }
  if ((int)v6stat.tmp._12_4_ < 0) {
    OPENSSL_memcpy(v6,local_3c,0x10);
  }
  else {
    OPENSSL_memcpy(v6,local_3c,(long)(int)v6stat.tmp._12_4_);
    OPENSSL_memset(v6 + (int)v6stat.tmp._12_4_,0,(long)(0x10 - v6stat.tmp._8_4_));
    if (v6stat.tmp._8_4_ != v6stat.tmp._12_4_) {
      OPENSSL_memcpy(v6 + (((long)(int)v6stat.tmp._12_4_ + 0x10) - (long)(int)v6stat.tmp._8_4_),
                     local_3c + (int)v6stat.tmp._12_4_,
                     (long)(int)(v6stat.tmp._8_4_ - v6stat.tmp._12_4_));
    }
  }
  return 1;
}

Assistant:

static int ipv6_from_asc(uint8_t v6[16], const char *in) {
  IPV6_STAT v6stat;
  v6stat.total = 0;
  v6stat.zero_pos = -1;
  v6stat.zero_cnt = 0;
  // Treat the IPv6 representation as a list of values separated by ':'.
  // The presence of a '::' will parse as one, two or three zero length
  // elements.
  if (!CONF_parse_list(in, ':', 0, ipv6_cb, &v6stat)) {
    return 0;
  }

  if (v6stat.zero_pos == -1) {
    // If no '::' must have exactly 16 bytes
    if (v6stat.total != 16) {
      return 0;
    }
  } else {
    // If '::' must have less than 16 bytes
    if (v6stat.total >= 16) {
      return 0;
    }
    if (v6stat.zero_cnt > 3) {
      // More than three zeroes is an error
      return 0;
    } else if (v6stat.zero_cnt == 3) {
      // Can only have three zeroes if nothing else present
      if (v6stat.total > 0) {
        return 0;
      }
    } else if (v6stat.zero_cnt == 2) {
      // Can only have two zeroes if at start or end
      if (v6stat.zero_pos != 0 && v6stat.zero_pos != v6stat.total) {
        return 0;
      }
    } else {
      // Can only have one zero if *not* start or end
      if (v6stat.zero_pos == 0 || v6stat.zero_pos == v6stat.total) {
        return 0;
      }
    }
  }

  // Format the result.
  if (v6stat.zero_pos >= 0) {
    // Copy initial part
    OPENSSL_memcpy(v6, v6stat.tmp, v6stat.zero_pos);
    // Zero middle
    OPENSSL_memset(v6 + v6stat.zero_pos, 0, 16 - v6stat.total);
    // Copy final part
    if (v6stat.total != v6stat.zero_pos) {
      OPENSSL_memcpy(v6 + v6stat.zero_pos + 16 - v6stat.total,
                     v6stat.tmp + v6stat.zero_pos,
                     v6stat.total - v6stat.zero_pos);
    }
  } else {
    OPENSSL_memcpy(v6, v6stat.tmp, 16);
  }

  return 1;
}